

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

void __thiscall
NativeCodeGenerator::FreeLoopBodyJobManager::QueueFreeLoopBodyJob
          (FreeLoopBodyJobManager *this,void *codeAddress,void *thunkAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  FreeLoopBodyJob *this_00;
  JobProcessor *pJVar4;
  CriticalSection *pCVar5;
  AutoOptionalCriticalSection local_b8;
  AutoOptionalCriticalSection lock_1;
  AutoOptionalCriticalSection local_a0;
  AutoOptionalCriticalSection lock;
  FreeLoopBodyJob stackJob;
  TrackAllocData local_50;
  FreeLoopBodyJob *local_28;
  FreeLoopBodyJob *job;
  void *thunkAddress_local;
  void *codeAddress_local;
  FreeLoopBodyJobManager *this_local;
  
  job = (FreeLoopBodyJob *)thunkAddress;
  thunkAddress_local = codeAddress;
  codeAddress_local = this;
  if ((this->isClosed & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0xd45,"(!this->isClosed)","!this->isClosed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&FreeLoopBodyJob::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
             ,0xd47);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
  this_00 = (FreeLoopBodyJob *)new<Memory::HeapAllocator>(0x38,alloc,true,0x469be0);
  FreeLoopBodyJob::FreeLoopBodyJob(this_00,(JobManager *)this,thunkAddress_local,job,true);
  local_28 = this_00;
  if (this_00 == (FreeLoopBodyJob *)0x0) {
    FreeLoopBodyJob::FreeLoopBodyJob
              ((FreeLoopBodyJob *)&lock,(JobManager *)this,thunkAddress_local,job,false);
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    pCVar5 = JsUtil::JobProcessor::GetCriticalSection(pJVar4);
    AutoOptionalCriticalSection::AutoOptionalCriticalSection(&local_a0,pCVar5);
    this->waitingForStackJob = true;
    this->stackJobProcessed = false;
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    (*pJVar4->_vptr_JobProcessor[2])(pJVar4,&lock,0);
    AutoOptionalCriticalSection::~AutoOptionalCriticalSection(&local_a0);
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    JsUtil::JobProcessor::
    PrioritizeJobAndWait<NativeCodeGenerator::FreeLoopBodyJobManager,NativeCodeGenerator::FreeLoopBodyJob*>
              (pJVar4,this,(FreeLoopBodyJob *)&lock,(void *)0x0);
  }
  else {
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    pCVar5 = JsUtil::JobProcessor::GetCriticalSection(pJVar4);
    AutoOptionalCriticalSection::AutoOptionalCriticalSection(&local_b8,pCVar5);
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    bVar2 = JsUtil::JobProcessor::HasManager(pJVar4,(JobManager *)this);
    if (bVar2) {
      pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
      JsUtil::JobProcessor::
      AddJobAndProcessProactively<NativeCodeGenerator::FreeLoopBodyJobManager,NativeCodeGenerator::FreeLoopBodyJob*>
                (pJVar4,this,local_28);
    }
    else {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,NativeCodeGenerator::FreeLoopBodyJob>
                (&Memory::HeapAllocator::Instance,local_28);
    }
    AutoOptionalCriticalSection::~AutoOptionalCriticalSection(&local_b8);
  }
  return;
}

Assistant:

void NativeCodeGenerator::FreeLoopBodyJobManager::QueueFreeLoopBodyJob(void* codeAddress, void * thunkAddress)
{
    Assert(!this->isClosed);

    FreeLoopBodyJob* job = HeapNewNoThrow(FreeLoopBodyJob, this, codeAddress, thunkAddress);

    if (job == nullptr)
    {
        FreeLoopBodyJob stackJob(this, codeAddress, thunkAddress, false /* heapAllocated */);

        {
            AutoOptionalCriticalSection lock(Processor()->GetCriticalSection());
#if DBG
            this->waitingForStackJob = true;
#endif
            this->stackJobProcessed = false;
            Processor()->AddJob(&stackJob);
        }
        Processor()->PrioritizeJobAndWait(this, &stackJob);
    }
    else
    {
        AutoOptionalCriticalSection lock(Processor()->GetCriticalSection());
        if (Processor()->HasManager(this))
        {
            Processor()->AddJobAndProcessProactively<FreeLoopBodyJobManager, FreeLoopBodyJob*>(this, job);
        }
        else
        {
            HeapDelete(job);
        }
    }
}